

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

int __thiscall el::base::SubsecondPrecision::init(SubsecondPrecision *this,EVP_PKEY_CTX *ctx)

{
  int width_local;
  SubsecondPrecision *this_local;
  
  width_local = (int)ctx;
  if ((width_local < 1) || (6 < width_local)) {
    width_local = 3;
  }
  this->m_width = width_local;
  switch(this->m_width) {
  case 3:
    this->m_offset = 1000;
    break;
  case 4:
    this->m_offset = 100;
    break;
  case 5:
    this->m_offset = 10;
    break;
  case 6:
    this->m_offset = 1;
    break;
  default:
    this->m_offset = 1000;
  }
  return (int)this;
}

Assistant:

void SubsecondPrecision::init(int width) {
  if (width < 1 || width > 6) {
    width = base::consts::kDefaultSubsecondPrecision;
  }
  m_width = width;
  switch (m_width) {
  case 3:
    m_offset = 1000;
    break;
  case 4:
    m_offset = 100;
    break;
  case 5:
    m_offset = 10;
    break;
  case 6:
    m_offset = 1;
    break;
  default:
    m_offset = 1000;
    break;
  }
}